

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression *
soul::ExpressionHelpers::forVariable
          (Expression *__return_storage_ptr__,VariableDeclaration *v,StringDictionary *dictionary)

{
  int iVar1;
  Expression *pEVar2;
  CallOrCast *pCVar3;
  pool_ptr<soul::AST::Expression> *this;
  pool_ptr<soul::AST::CallOrCast> cc;
  Type local_38;
  pool_ptr<soul::AST::Expression> local_20;
  
  if ((v->declaredType).object == (Expression *)0x0) {
    if ((v->initialValue).object == (Expression *)0x0) {
      throwInternalCompilerError("v.initialValue != nullptr","forVariable",0xb1);
    }
    this = &v->initialValue;
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(this);
    iVar1 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar2);
    if ((char)iVar1 != '\0') {
      pEVar2 = pool_ptr<soul::AST::Expression>::operator->(this);
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_38,pEVar2);
      create(__return_storage_ptr__,&local_38);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
      return __return_storage_ptr__;
    }
    local_20.object = this->object;
    cast<soul::AST::CallOrCast,soul::AST::Expression>((soul *)&local_38,&local_20);
    if (local_38._0_8_ == 0) {
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    pCVar3 = pool_ptr<soul::AST::CallOrCast>::operator->
                       ((pool_ptr<soul::AST::CallOrCast> *)&local_38);
    pEVar2 = (pCVar3->nameOrType).object;
  }
  else {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator*(&v->declaredType);
  }
  create(__return_storage_ptr__,pEVar2,dictionary);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression forVariable (AST::VariableDeclaration& v, const StringDictionary& dictionary)
    {
        if (v.declaredType != nullptr)
            return create (*v.declaredType, dictionary);

        SOUL_ASSERT (v.initialValue != nullptr);

        if (v.initialValue->isResolved())
            return create (v.initialValue->getResultType());

        if (auto cc = cast<AST::CallOrCast> (v.initialValue))
            return create (cc->nameOrType, dictionary);

        return {};
    }